

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O0

void __thiscall PA3Application::RenderObject::updateProgram(RenderObject *this)

{
  element_type *this_00;
  allocator<char> local_31;
  string local_30;
  RenderObject *local_10;
  RenderObject *this_local;
  
  local_10 = this;
  this_00 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"M",&local_31);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(this_00,&local_30,&this->m_mw);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void PA3Application::RenderObject::updateProgram() const
{
  m_prog->setUniform("M", m_mw);
}